

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O1

void ImGui::RenderDimmedBackgroundBehindWindow(ImGuiWindow *window,ImU32 col)

{
  int *piVar1;
  ImTextureID *ppvVar2;
  uint *puVar3;
  ImDrawList *this;
  ImDrawCmd *pIVar4;
  ImGuiViewport *pIVar5;
  long lVar6;
  ImDrawCmd *pIVar7;
  int iVar8;
  ImDrawCmd cmd;
  ImRect viewport_rect;
  ImDrawCmd local_78;
  ImVec2 local_38;
  ImVec2 local_30;
  ImVec2 IStack_28;
  
  if (0xffffff < col) {
    pIVar5 = GetMainViewport();
    IStack_28.x = (pIVar5->Pos).x + (pIVar5->Size).x;
    IStack_28.y = (pIVar5->Pos).y + (pIVar5->Size).y;
    local_30.x = (pIVar5->Pos).x;
    local_30.y = (pIVar5->Pos).y;
    this = window->RootWindow->DrawList;
    if ((this->CmdBuffer).Size == 0) {
      ImDrawList::AddDrawCmd(this);
    }
    local_78.ClipRect.y = local_30.y + -1.0;
    local_78.ClipRect.x = local_30.x + -1.0;
    local_38.y = IStack_28.y + 1.0;
    local_38.x = IStack_28.x + 1.0;
    ImDrawList::PushClipRect(this,(ImVec2 *)&local_78,&local_38,false);
    ImDrawList::AddRectFilled(this,&local_30,&IStack_28,col,0.0,0);
    lVar6 = (long)(this->CmdBuffer).Size;
    if (lVar6 < 1) {
      __assert_fail("Size > 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/iboB[P]BlockOut3000/build_O1/_deps/imgui-src/imgui.h"
                    ,0x70c,"T &ImVector<ImDrawCmd>::back() [T = ImDrawCmd]");
    }
    pIVar7 = (this->CmdBuffer).Data;
    pIVar4 = pIVar7 + lVar6 + -1;
    local_78.ClipRect.x = (pIVar4->ClipRect).x;
    local_78.ClipRect.y = (pIVar4->ClipRect).y;
    local_78.ClipRect.z = (pIVar4->ClipRect).z;
    local_78.ClipRect.w = (pIVar4->ClipRect).w;
    ppvVar2 = &pIVar7[lVar6 + -1].TextureId;
    local_78.TextureId._0_4_ = *(undefined4 *)ppvVar2;
    local_78.TextureId._4_4_ = *(undefined4 *)((long)ppvVar2 + 4);
    local_78.VtxOffset = *(uint *)(ppvVar2 + 1);
    local_78.IdxOffset = *(uint *)((long)ppvVar2 + 0xc);
    puVar3 = &pIVar7[lVar6 + -1].ElemCount;
    local_78.ElemCount = *puVar3;
    local_78._36_4_ = puVar3[1];
    local_78.UserCallback._0_4_ = puVar3[2];
    local_78.UserCallback._4_4_ = puVar3[3];
    local_78.UserCallbackData = pIVar7[lVar6 + -1].UserCallbackData;
    if (local_78.ElemCount != 6) {
      __assert_fail("cmd.ElemCount == 6",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/iboB[P]BlockOut3000/build_O1/_deps/imgui-src/imgui.cpp"
                    ,0x129f,"void ImGui::RenderDimmedBackgroundBehindWindow(ImGuiWindow *, ImU32)");
    }
    iVar8 = (this->CmdBuffer).Size;
    if (iVar8 < 1) {
      __assert_fail("Size > 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/iboB[P]BlockOut3000/build_O1/_deps/imgui-src/imgui.h"
                    ,0x719,"void ImVector<ImDrawCmd>::pop_back() [T = ImDrawCmd]");
    }
    iVar8 = iVar8 + -1;
    (this->CmdBuffer).Size = iVar8;
    if (iVar8 == 0) {
      if ((this->CmdBuffer).Capacity == 0) {
        if (GImGui != (ImGuiContext *)0x0) {
          piVar1 = &(GImGui->IO).MetricsActiveAllocations;
          *piVar1 = *piVar1 + 1;
        }
        pIVar7 = (ImDrawCmd *)(*GImAllocatorAllocFunc)(0x1c0,GImAllocatorUserData);
        pIVar4 = (this->CmdBuffer).Data;
        if (pIVar4 != (ImDrawCmd *)0x0) {
          memcpy(pIVar7,pIVar4,(long)(this->CmdBuffer).Size * 0x38);
          pIVar4 = (this->CmdBuffer).Data;
          if ((pIVar4 != (ImDrawCmd *)0x0) && (GImGui != (ImGuiContext *)0x0)) {
            piVar1 = &(GImGui->IO).MetricsActiveAllocations;
            *piVar1 = *piVar1 + -1;
          }
          (*GImAllocatorFreeFunc)(pIVar4,GImAllocatorUserData);
        }
        (this->CmdBuffer).Data = pIVar7;
        (this->CmdBuffer).Capacity = 8;
      }
      pIVar4 = (this->CmdBuffer).Data;
      iVar8 = (this->CmdBuffer).Size;
      pIVar4[iVar8].UserCallbackData = local_78.UserCallbackData;
      *(ulong *)&pIVar4[iVar8].ElemCount = CONCAT44(local_78._36_4_,local_78.ElemCount);
      *(ImDrawCallback *)(&pIVar4[iVar8].ElemCount + 2) =
           (ImDrawCallback)CONCAT44(local_78.UserCallback._4_4_,local_78.UserCallback._0_4_);
      pIVar4[iVar8].TextureId =
           (ImTextureID)CONCAT44(local_78.TextureId._4_4_,local_78.TextureId._0_4_);
      (&pIVar4[iVar8].TextureId)[1] = (ImTextureID)CONCAT44(local_78.IdxOffset,local_78.VtxOffset);
      pIVar4 = pIVar4 + iVar8;
      (pIVar4->ClipRect).x = local_78.ClipRect.x;
      (pIVar4->ClipRect).y = local_78.ClipRect.y;
      (pIVar4->ClipRect).z = local_78.ClipRect.z;
      (pIVar4->ClipRect).w = local_78.ClipRect.w;
      (this->CmdBuffer).Size = (this->CmdBuffer).Size + 1;
    }
    else {
      ImVector<ImDrawCmd>::insert(&this->CmdBuffer,(this->CmdBuffer).Data,&local_78);
    }
    ImDrawList::PopClipRect(this);
    ImDrawList::AddDrawCmd(this);
  }
  return;
}

Assistant:

static void ImGui::RenderDimmedBackgroundBehindWindow(ImGuiWindow* window, ImU32 col)
{
    if ((col & IM_COL32_A_MASK) == 0)
        return;

    ImGuiViewportP* viewport = (ImGuiViewportP*)GetMainViewport();
    ImRect viewport_rect = viewport->GetMainRect();

    // Draw behind window by moving the draw command at the FRONT of the draw list
    {
        // We've already called AddWindowToDrawData() which called DrawList->ChannelsMerge() on DockNodeHost windows,
        // and draw list have been trimmed already, hence the explicit recreation of a draw command if missing.
        // FIXME: This is creating complication, might be simpler if we could inject a drawlist in drawdata at a given position and not attempt to manipulate ImDrawCmd order.
        ImDrawList* draw_list = window->RootWindow->DrawList;
        if (draw_list->CmdBuffer.Size == 0)
            draw_list->AddDrawCmd();
        draw_list->PushClipRect(viewport_rect.Min - ImVec2(1, 1), viewport_rect.Max + ImVec2(1, 1), false); // Ensure ImDrawCmd are not merged
        draw_list->AddRectFilled(viewport_rect.Min, viewport_rect.Max, col);
        ImDrawCmd cmd = draw_list->CmdBuffer.back();
        IM_ASSERT(cmd.ElemCount == 6);
        draw_list->CmdBuffer.pop_back();
        draw_list->CmdBuffer.push_front(cmd);
        draw_list->PopClipRect();
        draw_list->AddDrawCmd(); // We need to create a command as CmdBuffer.back().IdxOffset won't be correct if we append to same command.
    }
}